

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::AsyncifyFlow::AsyncifyFlow
          (AsyncifyFlow *this,ModuleAnalyzer *analyzer,Type pointerType,Name asyncifyMemory)

{
  ModuleAnalyzer *analyzer_local;
  AsyncifyFlow *this_local;
  Name asyncifyMemory_local;
  Type pointerType_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__AsyncifyFlow_0309a1a8;
  this->analyzer = analyzer;
  (this->pointerType).id = pointerType.id;
  (this->asyncifyMemory).super_IString.str._M_len = asyncifyMemory.super_IString.str._M_len;
  (this->asyncifyMemory).super_IString.str._M_str = asyncifyMemory.super_IString.str._M_str;
  std::
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>>
  ::unique_ptr<std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>,void>
            ((unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>>
              *)&this->builder);
  this->callIndex = 0;
  return;
}

Assistant:

AsyncifyFlow(ModuleAnalyzer* analyzer, Type pointerType, Name asyncifyMemory)
    : analyzer(analyzer), pointerType(pointerType),
      asyncifyMemory(asyncifyMemory) {}